

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SincResampler.cpp
# Opt level: O0

void SRCTools::SincResampler::KaizerWindow::windowedSinc
               (FIRCoefficient *kernel,uint order,double fc,double beta,double amp)

{
  float fVar1;
  double dVar2;
  double dVar3;
  double __x;
  double local_90;
  FIRCoefficient imp;
  double sinc;
  double xs;
  double win;
  double xw;
  int j;
  int i;
  double mult;
  double recipOrder;
  double fc_pi;
  double amp_local;
  double beta_local;
  double fc_local;
  uint order_local;
  FIRCoefficient *kernel_local;
  
  dVar2 = bessel(beta);
  xw._0_4_ = 0;
  for (xw._4_4_ = order; -1 < (int)xw._4_4_; xw._4_4_ = xw._4_4_ - 2) {
    dVar3 = (double)(int)xw._4_4_ * (1.0 / (double)order);
    dVar3 = sqrt(ABS(-dVar3 * dVar3 + 1.0));
    dVar3 = bessel(beta * dVar3);
    __x = (double)(int)xw._4_4_ * fc * 3.141592653589793;
    if (xw._4_4_ == 0) {
      local_90 = 1.0;
    }
    else {
      local_90 = sin(__x);
      local_90 = local_90 / __x;
    }
    fVar1 = (float)(((fc * 2.0 * amp) / dVar2) * local_90 * dVar3);
    kernel[xw._0_4_] = fVar1;
    kernel[order - xw._0_4_] = fVar1;
    xw._0_4_ = xw._0_4_ + 1;
  }
  return;
}

Assistant:

void KaizerWindow::windowedSinc(FIRCoefficient kernel[], const unsigned int order, const double fc, const double beta, const double amp) {
	const double fc_pi = M_PI * fc;
	const double recipOrder = 1.0 / order;
	const double mult = 2.0 * fc * amp / bessel(beta);
	for (int i = order, j = 0; 0 <= i; i -= 2, ++j) {
		double xw = i * recipOrder;
		double win = bessel(beta * sqrt(fabs(1.0 - xw * xw)));
		double xs = i * fc_pi;
		double sinc = (i == 0) ? 1.0 : sin(xs) / xs;
		FIRCoefficient imp = FIRCoefficient(mult * sinc * win);
		kernel[j] = imp;
		kernel[order - j] = imp;
	}
}